

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::Promise<unsigned_long>::attach<kj::OwnFd,kj::OwnFd>
          (Promise<unsigned_long> *this,OwnFd *attachments,OwnFd *attachments_1)

{
  PromiseBase PVar1;
  int *in_RCX;
  PromiseBase local_28;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::OwnFd,_kj::OwnFd> local_20;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18;
  
  local_20.super_TupleElement<0U,_kj::OwnFd>.value.fd = (OwnFd)attachments_1->fd;
  attachments_1->fd = -1;
  local_20.super_TupleElement<1U,_kj::OwnFd>.value.fd = (OwnFd)*in_RCX;
  *in_RCX = -1;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::OwnFd,kj::OwnFd>>,kj::_::PromiseDisposer,kj::_::Tuple<kj::OwnFd,kj::OwnFd>>
            ((PromiseDisposer *)&local_28,(OwnPromiseNode *)attachments,
             (Tuple<kj::OwnFd,_kj::OwnFd> *)&local_20);
  PVar1.node.ptr = local_28.node.ptr;
  local_28.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_18);
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::OwnFd,_kj::OwnFd>_>,_kj::_::PromiseDisposer>::
  dispose((Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::OwnFd,_kj::OwnFd>_>,_kj::_::PromiseDisposer>
           *)&local_28);
  kj::_::TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::OwnFd,_kj::OwnFd>::~TupleImpl(&local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}